

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O1

void * bget(kmp_info_t *th,bufsize requested_size)

{
  bufsize *pbVar1;
  bget_mode_t bVar2;
  thr_data_t *ptVar3;
  long lVar4;
  bfhead *pbVar5;
  bget_acquire_t p_Var6;
  bfhead *pbVar7;
  int hi;
  int iVar8;
  size_t *psVar9;
  bfhead_t *pbVar10;
  ulong uVar11;
  char cVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  bfhead *pbVar17;
  size_t sVar18;
  int iVar19;
  bfhead *b;
  long lVar20;
  qlinks_t *unaff_R13;
  undefined1 auVar21 [16];
  
  if ((ulong)requested_size < 0x7fffffffffffffd9) {
    iVar19 = 0;
    ptVar3 = *(thr_data_t **)(th->th_pad + 0x118);
    __kmp_bget_dequeue(th);
    lVar15 = 0x10;
    if (0x10 < requested_size) {
      lVar15 = requested_size;
    }
    uVar14 = lVar15 + 7U & 0x7ffffffffffffff8;
    sVar18 = uVar14 + 0x20;
    bVar2 = ptVar3->mode;
    do {
      iVar8 = 0x13;
      iVar13 = 0;
      do {
        iVar16 = iVar8 + iVar13 >> 1;
        if ((long)sVar18 < bget_bin_size[iVar16]) {
          iVar8 = iVar16 + -1;
          iVar16 = iVar13;
        }
        iVar13 = iVar16;
      } while (1 < iVar8 - iVar13);
      if (iVar13 < 0x14) {
        lVar15 = (long)iVar13;
        do {
          pbVar17 = ptVar3->freelist + lVar15;
          b = (&(pbVar17->ql).flink)[bVar2 == bget_mode_lifo];
          pbVar7 = pbVar17;
          pbVar5 = b;
          if (ptVar3->mode == bget_mode_best) {
            for (; b = pbVar7, pbVar5 != pbVar17;
                pbVar5 = (&(pbVar5->ql).flink)[bVar2 == bget_mode_lifo]) {
              lVar4 = (pbVar5->bh).bb.bsize;
              if (((long)sVar18 <= lVar4) && ((b == pbVar17 || (lVar4 < (b->bh).bb.bsize)))) {
                b = pbVar5;
              }
              pbVar7 = b;
            }
          }
          for (; b != pbVar17; b = (&(b->ql).flink)[bVar2 == bget_mode_lifo]) {
            lVar4 = (b->bh).bb.bsize;
            lVar20 = lVar4 - sVar18;
            if ((long)sVar18 <= lVar4) {
              if (lVar20 < 0x31) {
                pbVar5 = (b->ql).blink;
                (pbVar5->ql).flink = (b->ql).flink;
                (((b->ql).flink)->ql).blink = pbVar5;
                ptVar3->totalloc = (b->bh).bb.bsize + ptVar3->totalloc;
                ptVar3->numget = ptVar3->numget + 1;
                pbVar1 = &(b->bh).bb.bsize;
                *pbVar1 = -*pbVar1;
                *(kmp_info_t **)((long)&b->bh + lVar4) = th;
                *(undefined8 *)((long)&b->bh + lVar4 + 8) = 0;
              }
              else {
                (b->bh).bb.bsize = lVar20;
                pbVar10 = (bfhead_t *)((long)b + lVar20);
                (pbVar10->bh).bb.prevfree = lVar20;
                (pbVar10->bh).bb.bsize = -0x20 - uVar14;
                (pbVar10->bh).bb.bthr = th;
                *(undefined8 *)((long)&b->bh + lVar4 + 8) = 0;
                pbVar5 = (b->ql).blink;
                (pbVar5->ql).flink = (b->ql).flink;
                (((b->ql).flink)->ql).blink = pbVar5;
                __kmp_bget_insert_into_freelist(ptVar3,b);
                ptVar3->totalloc = ptVar3->totalloc + sVar18;
                ptVar3->numget = ptVar3->numget + 1;
                b = pbVar10;
              }
              unaff_R13 = &b->ql;
              cVar12 = '\x01';
              goto LAB_00119f90;
            }
          }
          lVar15 = lVar15 + 1;
        } while ((int)lVar15 != 0x14);
      }
      if (ptVar3->compfcn == (bget_compact_t)0x0) {
        cVar12 = '\x02';
      }
      else {
        iVar19 = iVar19 + 1;
        iVar8 = (*ptVar3->compfcn)(sVar18,iVar19);
        cVar12 = (iVar8 == 0) * '\x02';
      }
LAB_00119f90:
    } while (cVar12 == '\0');
    if (cVar12 != '\x02') {
      return unaff_R13;
    }
    p_Var6 = ptVar3->acqfcn;
    if (p_Var6 != (bget_acquire_t)0x0) {
      if ((long)(ptVar3->exp_incr - 0x20U) < (long)sVar18) {
        sVar18 = uVar14 + 0x28;
        psVar9 = (size_t *)(*p_Var6)(sVar18);
        if (psVar9 != (size_t *)0x0) {
          psVar9[1] = (size_t)th;
          psVar9[2] = 0;
          psVar9[3] = 0;
          *psVar9 = sVar18;
          ptVar3->totalloc = sVar18 + ptVar3->totalloc;
          ptVar3->numget = ptVar3->numget + 1;
          ptVar3->numdget = ptVar3->numdget + 1;
          return psVar9 + 5;
        }
      }
      else {
        pbVar10 = (bfhead_t *)(*p_Var6)(ptVar3->exp_incr);
        if (pbVar10 != (bfhead_t *)0x0) {
          uVar14 = ptVar3->exp_incr;
          ptVar3 = *(thr_data_t **)(th->th_pad + 0x118);
          __kmp_bget_dequeue(th);
          uVar14 = uVar14 & 0xfffffffffffffff8;
          uVar11 = uVar14;
          if ((ptVar3->pool_len == 0) || (uVar11 = 0xffffffffffffffff, uVar14 != ptVar3->pool_len))
          {
            ptVar3->pool_len = uVar11;
          }
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          ptVar3->numpblk = ptVar3->numpblk + 1;
          ptVar3->numpget = ptVar3->numpget - auVar21._8_8_;
          (pbVar10->bh).bb.prevfree = 0;
          (pbVar10->bh).bb.bsize = uVar14 - 0x20;
          (pbVar10->bh).bb.bthr = (kmp_info_t *)((ulong)th | 1);
          __kmp_bget_insert_into_freelist(ptVar3,pbVar10);
          *(ulong *)((long)pbVar10 + (uVar14 - 0x18)) = uVar14 - 0x20;
          *(undefined8 *)((long)pbVar10 + (uVar14 - 0x10)) = 0x8000000000000000;
          unaff_R13 = (qlinks_t *)bget(th,requested_size);
        }
        if (pbVar10 != (bfhead_t *)0x0) {
          return unaff_R13;
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
bget(  kmp_info_t *th, bufsize requested_size )
{
    thr_data_t *thr = get_thr_data( th );
    bufsize size = requested_size;
    bfhead_t *b;
    void *buf;
    int compactseq = 0;
    int use_blink = 0;
/* For BestFit */
    bfhead_t *best;

    if ( size < 0 || size + sizeof( bhead_t ) > MaxSize ) {
        return NULL;
    }; // if

    __kmp_bget_dequeue( th );         /* Release any queued buffers */

    if (size < (bufsize)SizeQ) {      /* Need at least room for the */
        size = SizeQ;                 /*    queue links.  */
    }
    #if defined( SizeQuant ) && ( SizeQuant > 1 )
        size = (size + (SizeQuant - 1)) & (~(SizeQuant - 1));
    #endif

    size += sizeof(bhead_t);     /* Add overhead in allocated buffer
                                         to size required. */
    KMP_DEBUG_ASSERT( size >= 0 );
    KMP_DEBUG_ASSERT( size % SizeQuant == 0 );

    use_blink = ( thr->mode == bget_mode_lifo );

    /* If a compact function was provided in the call to bectl(), wrap
       a loop around the allocation process  to  allow  compaction  to
       intervene in case we don't find a suitable buffer in the chain. */

    for (;;) {
        int bin;

        for (bin = bget_get_bin( size ); bin < MAX_BGET_BINS; ++bin) {
            /* Link to next buffer */
            b = ( use_blink ? thr->freelist[ bin ].ql.blink : thr->freelist[ bin ].ql.flink );

            if (thr->mode == bget_mode_best) {
                best = &thr->freelist[ bin ];

                /* Scan the free list searching for the first buffer big enough
                   to hold the requested size buffer. */

                while (b != &thr->freelist[ bin ]) {
                    if (b->bh.bb.bsize >= (bufsize) size) {
                        if ((best == &thr->freelist[ bin ]) || (b->bh.bb.bsize < best->bh.bb.bsize)) {
                            best = b;
                        }
                    }

                    /* Link to next buffer */
                    b = ( use_blink ? b->ql.blink : b->ql.flink );
                }
                b = best;
            }

            while (b != &thr->freelist[ bin ]) {
                if ((bufsize) b->bh.bb.bsize >= (bufsize) size) {

                    /* Buffer  is big enough to satisfy  the request.  Allocate it
                       to the caller.  We must decide whether the buffer is  large
                       enough  to  split  into  the part given to the caller and a
                       free buffer that remains on the free list, or  whether  the
                       entire  buffer  should  be  removed  from the free list and
                       given to the caller in its entirety.   We  only  split  the
                       buffer if enough room remains for a header plus the minimum
                       quantum of allocation. */

                    if ((b->bh.bb.bsize - (bufsize) size) > (bufsize)(SizeQ + (sizeof(bhead_t)))) {
                        bhead_t *ba, *bn;

                        ba = BH(((char *) b) + (b->bh.bb.bsize - (bufsize) size));
                        bn = BH(((char *) ba) + size);

                        KMP_DEBUG_ASSERT(bn->bb.prevfree == b->bh.bb.bsize);

                        /* Subtract size from length of free block. */
                        b->bh.bb.bsize -= (bufsize) size;

                        /* Link allocated buffer to the previous free buffer. */
                        ba->bb.prevfree = b->bh.bb.bsize;

                        /* Plug negative size into user buffer. */
                        ba->bb.bsize = -size;

                        /* Mark this buffer as owned by this thread. */
                        TCW_PTR(ba->bb.bthr, th);   // not an allocated address (do not mark it)
                        /* Mark buffer after this one not preceded by free block. */
                        bn->bb.prevfree = 0;

                        /* unlink the buffer from the old freelist, and reinsert it into the new freelist */
                        __kmp_bget_remove_from_freelist( b );
                        __kmp_bget_insert_into_freelist( thr, b );
#if BufStats
                        thr->totalloc += (size_t) size;
                        thr->numget++;        /* Increment number of bget() calls */
#endif
                        buf = (void *) ((((char *) ba) + sizeof(bhead_t)));
                        KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                        return buf;
                    } else {
                        bhead_t *ba;

                        ba = BH(((char *) b) + b->bh.bb.bsize);

                        KMP_DEBUG_ASSERT(ba->bb.prevfree == b->bh.bb.bsize);

                        /* The buffer isn't big enough to split.  Give  the  whole
                           shebang to the caller and remove it from the free list. */

                       __kmp_bget_remove_from_freelist( b );
#if BufStats
                        thr->totalloc += (size_t) b->bh.bb.bsize;
                        thr->numget++;        /* Increment number of bget() calls */
#endif
                        /* Negate size to mark buffer allocated. */
                        b->bh.bb.bsize = -(b->bh.bb.bsize);

                        /* Mark this buffer as owned by this thread. */
                        TCW_PTR(ba->bb.bthr, th);   // not an allocated address (do not mark it)
                        /* Zero the back pointer in the next buffer in memory
                           to indicate that this buffer is allocated. */
                        ba->bb.prevfree = 0;

                        /* Give user buffer starting at queue links. */
                        buf =  (void *) &(b->ql);
                        KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                        return buf;
                    }
                }

                /* Link to next buffer */
                b = ( use_blink ? b->ql.blink : b->ql.flink );
            }
        }

        /* We failed to find a buffer.  If there's a compact  function
           defined,  notify  it  of the size requested.  If it returns
           TRUE, try the allocation again. */

        if ((thr->compfcn == 0) || (!(*thr->compfcn)(size, ++compactseq))) {
            break;
        }
    }

    /* No buffer available with requested size free. */

    /* Don't give up yet -- look in the reserve supply. */

    if (thr->acqfcn != 0) {
        if (size > (bufsize) (thr->exp_incr - sizeof(bhead_t))) {

            /* Request  is  too  large  to  fit in a single expansion
               block.  Try to satisy it by a direct buffer acquisition. */

            bdhead_t *bdh;

            size += sizeof(bdhead_t) - sizeof(bhead_t);

            KE_TRACE( 10, ("%%%%%% MALLOC( %d )\n", (int) size ) );

            /* richryan */
            bdh = BDH((*thr->acqfcn)((bufsize) size));
            if (bdh != NULL) {

                /*  Mark the buffer special by setting the size field
                    of its header to zero.  */
                bdh->bh.bb.bsize = 0;

                /* Mark this buffer as owned by this thread. */
                TCW_PTR(bdh->bh.bb.bthr, th);  // don't mark buffer as allocated,
                                               // because direct buffer never goes to free list
                bdh->bh.bb.prevfree = 0;
                bdh->tsize = size;
#if BufStats
                thr->totalloc += (size_t) size;
                thr->numget++;        /* Increment number of bget() calls */
                thr->numdget++;       /* Direct bget() call count */
#endif
                buf =  (void *) (bdh + 1);
                KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                return buf;
            }

        } else {

            /*  Try to obtain a new expansion block */

            void *newpool;

            KE_TRACE( 10, ("%%%%%% MALLOCB( %d )\n", (int) thr->exp_incr ) );

            /* richryan */
            newpool = (*thr->acqfcn)((bufsize) thr->exp_incr);
            KMP_DEBUG_ASSERT( ((size_t)newpool) % SizeQuant == 0 );
            if (newpool != NULL) {
                bpool( th, newpool, thr->exp_incr);
                buf =  bget( th, requested_size);  /* This can't, I say, can't get into a loop. */
                return buf;
            }
        }
    }

    /*  Still no buffer available */

    return NULL;
}